

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O1

Symbol * ehf_findsymbol(GlobalVars *gv,Section *sec,char *name)

{
  Symbol **ppSVar1;
  int iVar2;
  unsigned_long uVar3;
  Symbol *pSVar4;
  Symbol *pSVar5;
  bool bVar6;
  
  do {
    ppSVar1 = gv->symbols;
    uVar3 = elf_hash(name);
    pSVar4 = ppSVar1[uVar3 & 0xffff];
    bVar6 = pSVar4 == (Symbol *)0x0;
    if (bVar6) {
      pSVar5 = (Symbol *)0x0;
    }
    else {
      pSVar5 = (Symbol *)0x0;
      do {
        iVar2 = strcmp(name,pSVar4->name);
        if (iVar2 == 0) {
          if (pSVar5 == (Symbol *)0x0) {
            pSVar5 = pSVar4;
          }
          if (((sec == (Section *)0x0) || (pSVar4->type != '\x02')) ||
             (((pSVar4->relsect->flags ^ sec->flags) & 0x20) == 0)) break;
        }
        pSVar4 = pSVar4->glob_chain;
        bVar6 = pSVar4 == (Symbol *)0x0;
      } while (!bVar6);
    }
    if (pSVar5 == (Symbol *)0x0) {
      pSVar5 = pSVar4;
    }
    if (!bVar6) {
      pSVar5 = pSVar4;
    }
    if ((pSVar5 == (Symbol *)0x0) || (pSVar5->type != '\x04')) {
      return pSVar5;
    }
    name = pSVar5->indir_name;
  } while( true );
}

Assistant:

static struct Symbol *ehf_findsymbol(struct GlobalVars *gv,
                                     struct Section *sec,const char *name)
{
  struct Symbol *sym = gv->symbols[elf_hash(name)%SYMHTABSIZE];
  struct Symbol *second_choice = NULL;

  while (sym) {
    if (!strcmp(name,sym->name)) {
      if (second_choice == NULL)
        second_choice = sym;

      if (sec!=NULL && sym->type==SYM_RELOC) {
        /* we prefer symbols from a section which has the same CPU-flags
           as the caller's section */
        if ((sec->flags & SF_EHFPPC) == (sym->relsect->flags & SF_EHFPPC))
          break;
      }
      else
        break;
    }
    sym = sym->glob_chain;
  }

  /* accept symbol from a section for a different CPU, if it's the only one */
  if (!sym && second_choice)
    sym = second_choice;

  if (sym)
    if (sym->type == SYM_INDIR)
      return ehf_findsymbol(gv,sec,sym->indir_name);

  return sym;
}